

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

pair<pstore::uint128,_pstore::extent<unsigned_char>_> * __thiscall
pstore::serialize::
read<std::pair<pstore::uint128,pstore::extent<unsigned_char>>,pstore::serialize::archive::database_reader>
          (pair<pstore::uint128,_pstore::extent<unsigned_char>_> *__return_storage_ptr__,
          serialize *this,database_reader *archive)

{
  unique_ptr<std::pair<pstore::uint128,_pstore::extent<unsigned_char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
  local_50;
  unique_ptr<std::pair<pstore::uint128,_pstore::extent<unsigned_char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
  d;
  anon_class_1_0_00000001_for__M_head_impl dtor;
  T2 *t2;
  type uninit_buffer;
  database_reader *archive_local;
  
  flood<pstore::serialize::details::aligned_storage<32ul,16ul>::type>((type *)&t2);
  read_uninit<pstore::serialize::archive::database_reader,std::pair<pstore::uint128,pstore::extent<unsigned_char>>>
            ((database_reader *)this,(pointer)&t2);
  std::
  unique_ptr<std::pair<pstore::uint128,pstore::extent<unsigned_char>>,pstore::serialize::read<std::pair<pstore::uint128,pstore::extent<unsigned_char>>,pstore::serialize::archive::database_reader>(pstore::serialize::archive::database_reader&&)::{lambda(std::pair<pstore::uint128,pstore::extent<unsigned_char>>*)#1}>
  ::
  unique_ptr<pstore::serialize::read<std::pair<pstore::uint128,pstore::extent<unsigned_char>>,pstore::serialize::archive::database_reader>(pstore::serialize::archive::database_reader&&)::_lambda(std::pair<pstore::uint128,pstore::extent<unsigned_char>>*)_1_,void>
            ((unique_ptr<std::pair<pstore::uint128,pstore::extent<unsigned_char>>,pstore::serialize::read<std::pair<pstore::uint128,pstore::extent<unsigned_char>>,pstore::serialize::archive::database_reader>(pstore::serialize::archive::database_reader&&)::_lambda(std::pair<pstore::uint128,pstore::extent<unsigned_char>>*)_1_>
              *)&local_50,(pointer)&t2,
             (deleter_type *)
             ((long)&d._M_t.
                     super___uniq_ptr_impl<std::pair<pstore::uint128,_pstore::extent<unsigned_char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::pair<pstore::uint128,_pstore::extent<unsigned_char>_>_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
                     .
                     super__Head_base<0UL,_std::pair<pstore::uint128,_pstore::extent<unsigned_char>_>_*,_false>
                     ._M_head_impl + 7));
  *(T2 **)&(__return_storage_ptr__->first).v_ = t2;
  *(undefined8 *)((long)&(__return_storage_ptr__->first).v_ + 8) = uninit_buffer._._0_8_;
  (__return_storage_ptr__->second).addr.a_.a_ = uninit_buffer._._8_8_;
  (__return_storage_ptr__->second).size = uninit_buffer._._16_8_;
  std::
  unique_ptr<std::pair<pstore::uint128,_pstore::extent<unsigned_char>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/types.hpp:422:25)>
  ::~unique_ptr(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Ty read (Archive && archive) {
            using T2 = typename std::remove_const<Ty>::type;
            typename details::aligned_storage<sizeof (T2), alignof (T2)>::type uninit_buffer;
            flood (&uninit_buffer);

            // Deserialize into the uninitialized buffer.
            auto & t2 = reinterpret_cast<T2 &> (uninit_buffer);
            read_uninit (std::forward<Archive> (archive), t2);

            // This object will destroy the remains of the T2 instance in uninit_buffer.
            auto dtor = [] (T2 * p) { p->~T2 (); };
            std::unique_ptr<T2, decltype (dtor)> d (&t2, dtor);
            return std::move (t2);
        }